

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

Length __thiscall tcmalloc::PageHeap::ReleaseAtLeastNPages(PageHeap *this,Length num_pages)

{
  uint uVar1;
  Length LVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  int i;
  uint uVar5;
  
  uVar4 = 0;
  do {
    if ((num_pages <= uVar4) || ((this->stats_).free_bytes == 0)) {
      return uVar4;
    }
    uVar5 = 0;
    while ((uVar5 < 0x81 && (uVar4 < num_pages))) {
      uVar1 = this->release_index_;
      if (uVar1 < 0x81) {
        if (uVar1 != 0x80) goto LAB_0011b41f;
        if ((this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          p_Var3 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1;
          goto LAB_0011b434;
        }
        uVar1 = 0x80;
      }
      else {
        this->release_index_ = 0;
        uVar1 = 0;
LAB_0011b41f:
        if (this->free_[uVar1].normal.next != &this->free_[uVar1].normal) {
          p_Var3 = (_Base_ptr)&this->free_[uVar1].normal.prev;
LAB_0011b434:
          LVar2 = ReleaseSpan(this,*(Span **)p_Var3);
          if (LVar2 == 0) {
            return uVar4;
          }
          uVar4 = uVar4 + LVar2;
          uVar1 = this->release_index_;
        }
      }
      uVar5 = uVar5 + 1;
      this->release_index_ = uVar1 + 1;
    }
  } while( true );
}

Assistant:

Length PageHeap::ReleaseAtLeastNPages(Length num_pages) {
  ASSERT(lock_.IsHeld());
  Length released_pages = 0;

  // Round robin through the lists of free spans, releasing a
  // span from each list.  Stop after releasing at least num_pages
  // or when there is nothing more to release.
  while (released_pages < num_pages && stats_.free_bytes > 0) {
    for (int i = 0; i < kMaxPages+1 && released_pages < num_pages;
         i++, release_index_++) {
      Span *s;
      if (release_index_ > kMaxPages) release_index_ = 0;

      if (release_index_ == kMaxPages) {
        if (large_normal_.empty()) {
          continue;
        }
        s = (large_normal_.begin())->span;
      } else {
        SpanList* slist = &free_[release_index_];
        if (DLL_IsEmpty(&slist->normal)) {
          continue;
        }
        s = slist->normal.prev;
      }
      // TODO(todd) if the remaining number of pages to release
      // is significantly smaller than s->length, and s is on the
      // large freelist, should we carve s instead of releasing?
      // the whole thing?
      Length released_len = ReleaseSpan(s);
      // Some systems do not support release
      if (released_len == 0) return released_pages;
      released_pages += released_len;
    }
  }
  return released_pages;
}